

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rga.cpp
# Opt level: O0

MPP_RET rga_copy(RgaCtx ctx,MppFrame src,MppFrame dst)

{
  undefined2 uVar1;
  short sVar2;
  short sVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  MppFrameFormat MVar8;
  RgaFormat RVar9;
  RgaFormat RVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  RgaFormat dst_fmt;
  RgaFormat src_fmt;
  RgaReq *request;
  RK_S32 dst_fd;
  RK_S32 src_fd;
  RK_U32 dst_h;
  RK_U32 dst_w;
  RK_U32 src_h;
  RK_U32 src_w;
  MppBuffer dst_buf;
  MppBuffer src_buf;
  RgaCtxImpl *impl;
  MPP_RET ret;
  MppFrame dst_local;
  MppFrame src_local;
  RgaCtx ctx_local;
  
  uVar11 = mpp_frame_get_buffer(src);
  uVar12 = mpp_frame_get_buffer(dst);
  iVar4 = mpp_frame_get_width(src);
  iVar5 = mpp_frame_get_height(src);
  src_fd = mpp_frame_get_width(dst);
  dst_fd = mpp_frame_get_height(dst);
  iVar6 = mpp_buffer_get_fd_with_caller(uVar11,"rga_copy");
  iVar7 = mpp_buffer_get_fd_with_caller(uVar12);
  MVar8 = mpp_frame_get_fmt(src);
  RVar9 = rga_fmt_map(MVar8);
  MVar8 = mpp_frame_get_fmt(dst);
  RVar10 = rga_fmt_map(MVar8);
  if ((rga_debug & 1) != 0) {
    _mpp_log_l(4,0,"in\n");
  }
  if (((int)RVar9 < 0x14) && ((int)RVar10 < 0x14)) {
    if (((iVar4 == 0) || (iVar5 == 0)) &&
       (_mpp_log_l(2,0,"Assertion %s failed at %s:%d\n",0,"src_w > 0 && src_h > 0","rga_copy",0x136)
       , (_mpp_debug & 0x10000000) != 0)) {
      abort();
    }
    if ((src_fd == 0) || (dst_fd == 0)) {
      dst_fd = iVar5;
      src_fd = iVar4;
    }
    if ((rga_debug & 2) != 0) {
      _mpp_log_l(4,0,"[fd:w:h:fmt] src - %d:%d:%d:%d dst - %d:%d:%d:%d\n",0,iVar6,iVar4,iVar5,RVar9,
                 iVar7,src_fd,dst_fd,RVar10);
    }
    memset((void *)((long)ctx + 8),0,0x128);
    *(long *)((long)ctx + 0x10) = (long)iVar6;
    *(RgaFormat *)((long)ctx + 0x28) = RVar9;
    uVar1 = mpp_frame_get_hor_stride(src);
    *(undefined2 *)((long)ctx + 0x34) = uVar1;
    uVar1 = mpp_frame_get_ver_stride(src);
    *(undefined2 *)((long)ctx + 0x36) = uVar1;
    *(short *)((long)ctx + 0x2c) = (short)iVar4;
    *(short *)((long)ctx + 0x2e) = (short)iVar5;
    *(long *)((long)ctx + 0x40) = (long)iVar7;
    sVar2 = (short)src_fd;
    *(short *)((long)ctx + 100) = sVar2;
    sVar3 = (short)dst_fd;
    *(short *)((long)ctx + 0x66) = sVar3;
    *(RgaFormat *)((long)ctx + 0x58) = RVar10;
    *(undefined2 *)((long)ctx + 0xb0) = 0;
    *(short *)((long)ctx + 0xb2) = sVar2 + -1;
    *(undefined2 *)((long)ctx + 0xb4) = 0;
    *(short *)((long)ctx + 0xb6) = sVar3 + -1;
    *(short *)((long)ctx + 0x5c) = sVar2;
    *(short *)((long)ctx + 0x5e) = sVar3;
    config_rga_yuv2rgb_mode(ctx);
    *(undefined1 *)((long)ctx + 0x108) = 1;
    *(undefined4 *)((long)ctx + 0x118) = 1;
    *(undefined4 *)((long)ctx + 0x118) = 0x21;
    *(uint *)((long)ctx + 0x118) = *(uint *)((long)ctx + 0x118) | 0x80000500;
    impl._4_4_ = rga_ioctl((RgaCtxImpl *)ctx);
  }
  else {
    _mpp_log_l(2,0,"invalid input format for rga process src %d dst %d\n",0,RVar9,RVar10);
    impl._4_4_ = MPP_NOK;
  }
  if ((rga_debug & 1) != 0) {
    _mpp_log_l(4,0,"out\n","rga_copy");
  }
  return impl._4_4_;
}

Assistant:

MPP_RET rga_copy(RgaCtx ctx, MppFrame src, MppFrame dst)
{
    MPP_RET ret = MPP_OK;
    RgaCtxImpl *impl = (RgaCtxImpl *)ctx;
    MppBuffer src_buf = mpp_frame_get_buffer(src);
    MppBuffer dst_buf = mpp_frame_get_buffer(dst);
    RK_U32 src_w = mpp_frame_get_width(src);
    RK_U32 src_h = mpp_frame_get_height(src);
    RK_U32 dst_w = mpp_frame_get_width(dst);
    RK_U32 dst_h = mpp_frame_get_height(dst);
    RK_S32 src_fd = mpp_buffer_get_fd(src_buf);
    RK_S32 dst_fd = mpp_buffer_get_fd(dst_buf);
    RgaReq *request = &impl->request;

    RgaFormat src_fmt = rga_fmt_map(mpp_frame_get_fmt(src));
    RgaFormat dst_fmt = rga_fmt_map(mpp_frame_get_fmt(dst));

    rga_dbg_func("in\n");

    if (src_fmt >= RGA_FMT_BUTT || dst_fmt >= RGA_FMT_BUTT) {
        mpp_err("invalid input format for rga process src %d dst %d\n",
                src_fmt, dst_fmt);
        ret = MPP_NOK;
        goto END;
    }

    mpp_assert(src_w > 0 && src_h > 0);

    if (dst_w == 0 || dst_h == 0) {
        dst_w = src_w;
        dst_h = src_h;
    }

    rga_dbg_copy("[fd:w:h:fmt] src - %d:%d:%d:%d dst - %d:%d:%d:%d\n",
                 src_fd, src_w, src_h, src_fmt,
                 dst_fd, dst_w, dst_h, dst_fmt);

    memset(request, 0, sizeof(*request));
    request->src.yrgb_addr = src_fd;
    request->src.format = (RK_U32)src_fmt;
    request->src.vir_w = mpp_frame_get_hor_stride(src);
    request->src.vir_h = mpp_frame_get_ver_stride(src);
    request->src.act_w = src_w;
    request->src.act_h = src_h;

    request->dst.yrgb_addr = dst_fd;
    request->dst.vir_w = dst_w;
    request->dst.vir_h = dst_h;
    request->dst.format = (RK_U32)dst_fmt;
    request->clip.xmin = 0;
    request->clip.xmax = dst_w - 1;
    request->clip.ymin = 0;
    request->clip.ymax = dst_h - 1;
    request->dst.act_w = dst_w;
    request->dst.act_h = dst_h;

    config_rga_yuv2rgb_mode(ctx);

    request->mmu_info.mmu_en = 1;
    request->mmu_info.mmu_flag = 1;
    request->mmu_info.mmu_flag = ((2 & 0x3) << 4) | 1;
    request->mmu_info.mmu_flag |= (1 << 31) | (1 << 10) | (1 << 8);

    ret = rga_ioctl(impl);
END:
    rga_dbg_func("out\n");
    return ret;
}